

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

void ELFIO::dump::notes(ostream *out,elfio *reader)

{
  bool bVar1;
  int iVar2;
  Elf_Word EVar3;
  pointer psVar4;
  ostream *poVar5;
  char *pcVar6;
  Elf_Word local_13c;
  char *pcStack_138;
  Elf_Word descsz_1;
  char *desc_1;
  string name_1;
  Elf_Word local_108;
  Elf_Word type_1;
  Elf_Word j_1;
  Elf_Word no_notes_1;
  note_segment_accessor notes_1;
  segment *seg;
  Elf_Half i;
  Elf_Half no;
  Elf_Word descsz;
  char *desc;
  string name;
  Elf_Word type;
  Elf_Word j;
  undefined4 local_78;
  Elf_Word local_64;
  undefined1 local_60 [4];
  Elf_Word no_notes;
  note_section_accessor notes;
  unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *sec;
  const_iterator __end2;
  const_iterator __begin2;
  Sections *__range2;
  elfio *reader_local;
  ostream *out_local;
  
  __end2 = elfio::Sections::begin(&reader->sections);
  sec = (unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
        elfio::Sections::end(&reader->sections);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
                                     *)&sec), bVar1) {
    notes.note_start_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
                  ::operator*(&__end2);
    psVar4 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::operator->
                       ((unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
                        notes.note_start_positions.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    iVar2 = (*psVar4->_vptr_section[5])();
    if (iVar2 == 7) {
      psVar4 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::get
                         ((unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
                          notes.note_start_positions.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
      note_section_accessor_template
                ((note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size> *)
                 local_60,reader,psVar4);
      local_64 = note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
                 get_notes_num((note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>
                                *)local_60);
      if (local_64 == 0) {
        local_78 = 3;
      }
      else {
        poVar5 = std::operator<<(out,"Note section (");
        psVar4 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::operator->
                           ((unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
                            notes.note_start_positions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        (*psVar4->_vptr_section[3])(&type);
        poVar5 = std::operator<<(poVar5,(string *)&type);
        poVar5 = std::operator<<(poVar5,")");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"    No Name         Data size  Description");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&type);
        for (name.field_2._12_4_ = 0; (uint)name.field_2._12_4_ < local_64;
            name.field_2._12_4_ = name.field_2._12_4_ + 1) {
          std::__cxx11::string::string((string *)&desc);
          bVar1 = note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
                  get_note((note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>
                            *)local_60,name.field_2._12_4_,
                           (Elf_Word *)(name.field_2._M_local_buf + 8),(string *)&desc,(char **)&i,
                           (Elf_Word *)((long)&seg + 4));
          if (bVar1) {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::__cxx11::string::operator=((string *)&desc,pcVar6);
            note(out,name.field_2._12_4_,name.field_2._8_4_,(string *)&desc,_i,seg._4_4_);
            std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
          }
          std::__cxx11::string::~string((string *)&desc);
        }
        std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
        local_78 = 0;
      }
      note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
      ~note_section_accessor_template
                ((note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size> *)
                 local_60);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
    ::operator++(&__end2);
  }
  seg._2_2_ = elfio::Segments::size(&reader->segments);
  for (seg._0_2_ = 0; (ushort)seg < seg._2_2_; seg._0_2_ = (ushort)seg + 1) {
    notes_1.note_start_positions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)elfio::Segments::operator[](&reader->segments,(uint)(ushort)seg);
    iVar2 = (*((segment *)
              notes_1.note_start_positions.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)->_vptr_segment[3])();
    if (iVar2 == 4) {
      note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>::
      note_section_accessor_template
                ((note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size> *)
                 &j_1,reader,
                 (segment *)
                 notes_1.note_start_positions.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      EVar3 = note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>::
              get_notes_num((note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>
                             *)&j_1);
      if (EVar3 == 0) {
        local_78 = 9;
      }
      else {
        poVar5 = std::operator<<(out,"Note segment (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ushort)seg);
        poVar5 = std::operator<<(poVar5,")");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"    No Name         Data size  Description");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        for (local_108 = 0; local_108 < EVar3; local_108 = local_108 + 1) {
          std::__cxx11::string::string((string *)&desc_1);
          bVar1 = note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>::
                  get_note((note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>
                            *)&j_1,local_108,(Elf_Word *)(name_1.field_2._M_local_buf + 0xc),
                           (string *)&desc_1,&stack0xfffffffffffffec8,&local_13c);
          if (bVar1) {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::__cxx11::string::operator=((string *)&desc_1,pcVar6);
            note(out,local_108,name_1.field_2._12_4_,(string *)&desc_1,pcStack_138,local_13c);
            std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
          }
          std::__cxx11::string::~string((string *)&desc_1);
        }
        std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
        local_78 = 0;
      }
      note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size>::
      ~note_section_accessor_template
                ((note_section_accessor_template<ELFIO::segment,_&ELFIO::segment::get_file_size> *)
                 &j_1);
    }
  }
  return;
}

Assistant:

static void notes( std::ostream& out, const elfio& reader )
    {
        for ( const auto& sec : reader.sections ) { // For all sections
            if ( SHT_NOTE == sec->get_type() ) {    // Look at notes
                note_section_accessor notes( reader, sec.get() );
                Elf_Word              no_notes = notes.get_notes_num();

                if ( no_notes == 0 )
                    continue;

                out << "Note section (" << sec->get_name() << ")" << std::endl
                    << "    No Name         Data size  Description"
                    << std::endl;
                for ( Elf_Word j = 0; j < no_notes; ++j ) { // For all notes
                    Elf_Word    type;
                    std::string name;
                    char*       desc;
                    Elf_Word    descsz;

                    if ( notes.get_note( j, type, name, desc, descsz ) ) {
                        // 'name' usually contains \0 at the end. Remove it
                        name = name.c_str();
                        note( out, j, type, name, desc, descsz );
                        out << std::endl;
                    }
                }

                out << std::endl;
            }
        }

        Elf_Half no = reader.segments.size();
        for ( Elf_Half i = 0; i < no; ++i ) { // For all segments
            segment* seg = reader.segments[i];
            if ( PT_NOTE == seg->get_type() ) { // Look at notes
                note_segment_accessor notes( reader, seg );
                Elf_Word              no_notes = notes.get_notes_num();

                if ( no_notes == 0 )
                    continue;

                out << "Note segment (" << i << ")" << std::endl
                    << "    No Name         Data size  Description"
                    << std::endl;
                for ( Elf_Word j = 0; j < no_notes; ++j ) { // For all notes
                    Elf_Word    type;
                    std::string name;
                    char*       desc;
                    Elf_Word    descsz;

                    if ( notes.get_note( j, type, name, desc, descsz ) ) {
                        // 'name' usually contains \0 at the end. Remove it
                        name = name.c_str();
                        note( out, j, type, name, desc, descsz );
                        out << std::endl;
                    }
                }

                out << std::endl;
            }
        }
    }